

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O1

void psh_blues_set_zones(PSH_Blues target,FT_UInt count,FT_Short *blues,FT_UInt count_others,
                        FT_Short *other_blues,FT_Int fuzz,FT_Int family)

{
  FT_UInt FVar1;
  PSH_Blues top_table;
  FT_Int *pFVar2;
  FT_UInt FVar3;
  int iVar4;
  PSH_Blue_ZoneRec *pPVar5;
  FT_UInt FVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_0000008c;
  PSH_Blue_Table bot_table;
  PSH_Blues read;
  FT_Int *pFVar10;
  bool bVar11;
  
  bot_table = (PSH_Blue_Table)CONCAT44(in_register_0000008c,fuzz);
  read = (PSH_Blues)&target->family_top;
  top_table = (PSH_Blues)&target->family_bottom;
  if (family == 0) {
    read = target;
    top_table = (PSH_Blues)&target->normal_bottom;
  }
  (read->normal_top).count = 0;
  (top_table->normal_top).count = 0;
  psh_blues_set_zones_0
            ((PSH_Blues)0x0,(FT_Bool)count,(FT_UInt)blues,(FT_Short *)read,&top_table->normal_top,
             bot_table);
  psh_blues_set_zones_0
            ((PSH_Blues)&DAT_00000001,(FT_Bool)count_others,(FT_UInt)other_blues,(FT_Short *)read,
             &top_table->normal_top,bot_table);
  FVar3 = (read->normal_top).count;
  FVar1 = (top_table->normal_top).count;
  if (FVar3 != 0) {
    pPVar5 = (read->normal_top).zones;
    FVar6 = FVar3;
    do {
      if (FVar6 != 1) {
        if (FVar6 == 0) break;
        iVar8 = pPVar5[1].org_ref - pPVar5->org_ref;
        if (iVar8 < pPVar5->org_delta) {
          pPVar5->org_delta = iVar8;
        }
      }
      pPVar5->org_bottom = pPVar5->org_ref;
      pPVar5->org_top = pPVar5->org_ref + pPVar5->org_delta;
      FVar6 = FVar6 - 1;
      pPVar5 = pPVar5 + 1;
    } while( true );
  }
  if (FVar1 == 0) {
LAB_00215237:
    iVar8 = 1;
    do {
      if (FVar3 != 0) {
        pFVar2 = &(read->normal_top).zones[0].org_bottom;
        *pFVar2 = *pFVar2 - fuzz;
        iVar7 = (read->normal_top).zones[0].org_top;
        iVar4 = FVar3 - 1;
        if (iVar4 == 0) {
          pPVar5 = (read->normal_top).zones;
        }
        else {
          pFVar2 = &(read->normal_top).zones[1].org_bottom;
          do {
            pFVar10 = pFVar2;
            iVar9 = (*pFVar10 - iVar7) / 2;
            if (iVar9 < fuzz) {
              iVar9 = iVar9 + iVar7;
              *pFVar10 = iVar9;
              pFVar10[-0xd] = iVar9;
            }
            else {
              pFVar10[-0xd] = iVar7 + fuzz;
              *pFVar10 = *pFVar10 - fuzz;
            }
            iVar7 = pFVar10[-1];
            iVar4 = iVar4 + -1;
            pFVar2 = pFVar10 + 0xc;
          } while (iVar4 != 0);
          pPVar5 = (PSH_Blue_ZoneRec *)(pFVar10 + -3);
        }
        pPVar5->org_top = iVar7 + fuzz;
      }
      bVar11 = iVar8 != 0;
      iVar8 = iVar8 + -1;
      read = top_table;
      FVar3 = FVar1;
    } while (bVar11);
    return;
  }
  pPVar5 = (top_table->normal_top).zones;
  FVar6 = FVar1;
  do {
    if (FVar6 != 1) {
      if (FVar6 == 0) goto LAB_00215237;
      iVar8 = pPVar5->org_ref - pPVar5[1].org_ref;
      if (pPVar5->org_delta < iVar8) {
        pPVar5->org_delta = iVar8;
      }
    }
    pPVar5->org_top = pPVar5->org_ref;
    pPVar5->org_bottom = pPVar5->org_ref + pPVar5->org_delta;
    FVar6 = FVar6 - 1;
    pPVar5 = pPVar5 + 1;
  } while( true );
}

Assistant:

static void
  psh_blues_set_zones( PSH_Blues  target,
                       FT_UInt    count,
                       FT_Short*  blues,
                       FT_UInt    count_others,
                       FT_Short*  other_blues,
                       FT_Int     fuzz,
                       FT_Int     family )
  {
    PSH_Blue_Table  top_table, bot_table;
    FT_UInt         count_top, count_bot;


    if ( family )
    {
      top_table = &target->family_top;
      bot_table = &target->family_bottom;
    }
    else
    {
      top_table = &target->normal_top;
      bot_table = &target->normal_bottom;
    }

    /* read the input blue zones, and build two sorted tables  */
    /* (one for the top zones, the other for the bottom zones) */
    top_table->count = 0;
    bot_table->count = 0;

    /* first, the blues */
    psh_blues_set_zones_0( target, 0,
                           count, blues, top_table, bot_table );
    psh_blues_set_zones_0( target, 1,
                           count_others, other_blues, top_table, bot_table );

    count_top = top_table->count;
    count_bot = bot_table->count;

    /* sanitize top table */
    if ( count_top > 0 )
    {
      PSH_Blue_Zone  zone = top_table->zones;


      for ( count = count_top; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[1].org_ref - zone[0].org_ref;
          if ( zone->org_delta > delta )
            zone->org_delta = delta;
        }

        zone->org_bottom = zone->org_ref;
        zone->org_top    = zone->org_delta + zone->org_ref;
      }
    }

    /* sanitize bottom table */
    if ( count_bot > 0 )
    {
      PSH_Blue_Zone  zone = bot_table->zones;


      for ( count = count_bot; count > 0; count--, zone++ )
      {
        FT_Int  delta;


        if ( count > 1 )
        {
          delta = zone[0].org_ref - zone[1].org_ref;
          if ( zone->org_delta < delta )
            zone->org_delta = delta;
        }

        zone->org_top    = zone->org_ref;
        zone->org_bottom = zone->org_delta + zone->org_ref;
      }
    }

    /* expand top and bottom tables with blue fuzz */
    {
      FT_Int         dim, top, bot, delta;
      PSH_Blue_Zone  zone;


      zone  = top_table->zones;
      count = count_top;

      for ( dim = 1; dim >= 0; dim-- )
      {
        if ( count > 0 )
        {
          /* expand the bottom of the lowest zone normally */
          zone->org_bottom -= fuzz;

          /* expand the top and bottom of intermediate zones;    */
          /* checking that the interval is smaller than the fuzz */
          top = zone->org_top;

          for ( count--; count > 0; count-- )
          {
            bot   = zone[1].org_bottom;
            delta = bot - top;

            if ( delta / 2 < fuzz )
              zone[0].org_top = zone[1].org_bottom = top + delta / 2;
            else
            {
              zone[0].org_top    = top + fuzz;
              zone[1].org_bottom = bot - fuzz;
            }

            zone++;
            top = zone->org_top;
          }

          /* expand the top of the highest zone normally */
          zone->org_top = top + fuzz;
        }
        zone  = bot_table->zones;
        count = count_bot;
      }
    }
  }